

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O2

Error __thiscall asmjit::BaseAssembler::comment(BaseAssembler *this,char *data,size_t size)

{
  byte bVar1;
  Logger *pLVar2;
  Error EVar3;
  
  bVar1 = (this->super_BaseEmitter)._emitterFlags;
  if ((bVar1 & 8) == 0) {
    if ((bVar1 & 1) == 0) {
      EVar3 = BaseEmitter::reportError(&this->super_BaseEmitter,5,(char *)0x0);
      return EVar3;
    }
  }
  else {
    pLVar2 = (this->super_BaseEmitter)._logger;
    if (pLVar2 == (Logger *)0x0) {
      DebugUtils::assertionFailed
                ("/workspace/llm4binary/github/license_c_cmakelists/comsec-group[P]blacksmith/build_O2/_deps/asmjit-src/src/asmjit/core/assembler.cpp"
                 ,0x179,"_logger != nullptr");
    }
    (*pLVar2->_vptr_Logger[2])();
    pLVar2 = (this->super_BaseEmitter)._logger;
    (*pLVar2->_vptr_Logger[2])(pLVar2,"\n",1);
  }
  return 0;
}

Assistant:

Error BaseAssembler::comment(const char* data, size_t size) {
  if (!hasEmitterFlag(kFlagLogComments)) {
    if (!hasEmitterFlag(kFlagAttached))
      return reportError(DebugUtils::errored(kErrorNotInitialized));
    return kErrorOk;
  }

#ifndef ASMJIT_NO_LOGGING
  // Logger cannot be NULL if `kFlagLogComments` is set.
  ASMJIT_ASSERT(_logger != nullptr);

  _logger->log(data, size);
  _logger->log("\n", 1);
  return kErrorOk;
#else
  DebugUtils::unused(data, size);
  return kErrorOk;
#endif
}